

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emle.c
# Opt level: O0

double fcss(double *b,int pq,void *params)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  void *__ptr;
  void *__ptr_00;
  double dVar5;
  alik_css_object obj;
  double *theta;
  double *phi;
  int iter;
  int jm;
  int j;
  int ncond;
  int i;
  int N;
  int iq;
  int ip;
  double temp;
  double ssq;
  double value;
  void *params_local;
  int pq_local;
  double *b_local;
  
  iVar1 = *params;
  iVar2 = *(int *)((long)params + 8);
  iVar3 = *(int *)((long)params + 0x18);
  temp = 0.0;
  phi._0_4_ = 0;
  __ptr = malloc((long)iVar1 << 3);
  __ptr_00 = malloc((long)iVar2 << 3);
  for (j = 0; j < iVar1; j = j + 1) {
    *(double *)((long)__ptr + (long)j * 8) = b[j];
  }
  for (j = 0; j < iVar2; j = j + 1) {
    *(double *)((long)__ptr_00 + (long)j * 8) = b[j + iVar1];
  }
  for (j = 0; j < iVar1; j = j + 1) {
    *(undefined8 *)((long)params + (long)(iVar3 + j) * 8 + 0x680) = 0;
  }
  iVar4 = iVar1;
  if (*(int *)((long)params + 0x1c) == 1) {
    for (j = 0; j < iVar3; j = j + 1) {
      *(double *)((long)params + (long)j * 8 + 0x680) =
           *(double *)((long)params + (long)(iVar3 * 2 + j) * 8 + 0x680) - b[iVar1 + iVar2];
    }
  }
  while (j = iVar4, j < iVar3) {
    phi._0_4_ = (int)phi + 1;
    _iq = *(double *)((long)params + (long)j * 8 + 0x680);
    for (iter = 0; iter < iVar1; iter = iter + 1) {
      _iq = -*(double *)((long)__ptr + (long)iter * 8) *
            *(double *)((long)params + (long)((j - iter) + -1) * 8 + 0x680) + _iq;
    }
    phi._4_4_ = iVar2;
    if (j - iVar1 < iVar2) {
      phi._4_4_ = j - iVar1;
    }
    for (iter = 0; iter < phi._4_4_; iter = iter + 1) {
      _iq = -*(double *)((long)__ptr_00 + (long)iter * 8) *
            *(double *)((long)params + (long)(((iVar3 + j) - iter) + -1) * 8 + 0x680) + _iq;
    }
    *(double *)((long)params + (long)(iVar3 + j) * 8 + 0x680) = _iq;
    temp = _iq * _iq + temp;
    iVar4 = j + 1;
  }
  *(double *)((long)params + 0x30) = temp;
  dVar5 = log(temp / (double)(int)phi);
  *(double *)((long)params + 0x38) = dVar5 * 0.5;
  free(__ptr);
  free(__ptr_00);
  return dVar5 * 0.5;
}

Assistant:

double fcss(double *b, int pq, void *params) {
	double value,ssq,temp;
	int ip, iq, N,i,ncond,j,jm,iter;
	double *phi, *theta;
	alik_css_object obj = (alik_css_object)params;

	ip = obj->p;
	iq = obj->q;

	N = obj->N;

	value = ssq = 0.0;
	ncond = ip;
	iter = 0;
	phi = (double*)malloc(sizeof(double)* ip);
	theta = (double*)malloc(sizeof(double)* iq);

	for (i = 0; i < ip; ++i) {
		phi[i] = b[i];
	}

	for (i = 0; i < iq; ++i) {
		theta[i] = b[i + ip];
	}

	for (i = 0; i < ncond; ++i) {
		obj->x[N + i] = 0.0;
	}

	if (obj->M == 1) {
		for (i = 0; i < N; ++i) {
			obj->x[i] = obj->x[2 * N + i] - b[ip+iq];
		}
	}

	for (i = ncond; i < N; ++i) {
		iter++;
		temp = obj->x[i];

		for (j = 0; j < ip; ++j) {
			temp = temp -  phi[j] * obj->x[i - j - 1];
		}

		if (i - ncond < iq) {
			jm = i - ncond;
		}
		else {
			jm = iq;
		}

		for (j = 0; j < jm; ++j) {
			temp = temp - theta[j] * obj->x[N + i - j - 1];
		}

		obj->x[N + i] = temp;
		ssq += temp * temp;
	}
	obj->ssq = ssq;
	value = 0.5 * log(ssq / (double)iter);
	obj->loglik = value;

	free(phi);
	free(theta);
	return value;
}